

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_write.h
# Opt level: O0

int stbi_write_hdr_core(stbi__write_context *s,int x,int y,int comp,float *data)

{
  int iVar1;
  uchar *scratch_00;
  int local_144;
  undefined1 local_118 [8];
  char header [66];
  char local_c8 [8];
  char buffer [128];
  int local_3c;
  int len;
  int i;
  uchar *scratch;
  float *data_local;
  int comp_local;
  int y_local;
  int x_local;
  stbi__write_context *s_local;
  
  if (((y < 1) || (x < 1)) || (data == (float *)0x0)) {
    s_local._4_4_ = 0;
  }
  else {
    scratch_00 = (uchar *)malloc((long)(x << 2));
    memcpy(local_118,"#?RADIANCE\n# Written by stb_image_write.h\nFORMAT=32-bit_rle_rgbe\n",0x42);
    (*s->func)(s->context,local_118,0x41);
    iVar1 = sprintf(local_c8,"EXPOSURE=          1.0000000000000\n\n-Y %d +X %d\n",(ulong)(uint)y,
                    (ulong)(uint)x);
    (*s->func)(s->context,local_c8,iVar1);
    for (local_3c = 0; local_3c < y; local_3c = local_3c + 1) {
      if (stbi__flip_vertically_on_write == 0) {
        local_144 = local_3c;
      }
      else {
        local_144 = (y + -1) - local_3c;
      }
      stbiw__write_hdr_scanline(s,x,comp,scratch_00,data + comp * x * local_144 * x);
    }
    free(scratch_00);
    s_local._4_4_ = 1;
  }
  return s_local._4_4_;
}

Assistant:

static int stbi_write_hdr_core(stbi__write_context *s, int x, int y, int comp,
                               float *data) {
  if (y <= 0 || x <= 0 || data == NULL)
    return 0;
  else {
    // Each component is stored separately. Allocate scratch space for full
    // output scanline.
    unsigned char *scratch = (unsigned char *)STBIW_MALLOC(x * 4);
    int i, len;
    char buffer[128];
    char header[] =
        "#?RADIANCE\n# Written by stb_image_write.h\nFORMAT=32-bit_rle_rgbe\n";
    s->func(s->context, header, sizeof(header) - 1);

#ifdef STBI_MSC_SECURE_CRT
    len = sprintf_s(
        buffer, "EXPOSURE=          1.0000000000000\n\n-Y %d +X %d\n", y, x);
#else
    len = sprintf(buffer, "EXPOSURE=          1.0000000000000\n\n-Y %d +X %d\n",
                  y, x);
#endif
    s->func(s->context, buffer, len);

    for (i = 0; i < y; i++)
      stbiw__write_hdr_scanline(
          s, x, comp, scratch,
          data +
              comp * x * (stbi__flip_vertically_on_write ? y - 1 - i : i) * x);
    STBIW_FREE(scratch);
    return 1;
  }
}